

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
EqualNode::Evaluate(string *__return_storage_ptr__,EqualNode *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parameters,cmGeneratorExpressionContext *context,
                   GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  char *rhs;
  char *lhs;
  cmGeneratorExpressionContext *local_b0;
  string local_a8;
  long local_88;
  int *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *pEnd;
  
  lhs = (((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_b0 = context;
  bVar1 = cmHasLiteralPrefix<char_const*,3ul>(&lhs,(char (*) [3])0x52e465);
  if (bVar1) {
LAB_00415a7c:
    lhs = lhs + 2;
    iVar6 = 2;
  }
  else {
    bVar1 = cmHasLiteralPrefix<char_const*,3ul>(&lhs,(char (*) [3])0x52e469);
    iVar6 = 0;
    if (bVar1) goto LAB_00415a7c;
  }
  bVar1 = cmHasLiteralPrefix<char_const*,4ul>(&lhs,(char (*) [4])"-0b");
  if ((bVar1) || (bVar1 = cmHasLiteralPrefix<char_const*,4ul>(&lhs,(char (*) [4])"-0B"), bVar1)) {
    lhs = lhs + 3;
    bVar1 = true;
    iVar6 = 2;
  }
  else {
    bVar1 = false;
  }
  bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&lhs,(char (*) [4])"+0b");
  if ((bVar2) || (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&lhs,(char (*) [4])"+0B"), bVar2)) {
    lhs = lhs + 3;
    iVar6 = 2;
  }
  lVar3 = strtol(lhs,&pEnd,iVar6);
  if (((pEnd == lhs) || (*pEnd != '\0')) || (piVar4 = __errno_location(), *piVar4 == 0x22)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_a8,content);
    std::operator+(&local_78,"$<EQUAL> parameter ",
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&local_58,&local_78," is not a valid integer.");
    reportError(local_b0,&local_a8,&local_58);
    goto LAB_00415b80;
  }
  local_88 = -lVar3;
  if (!bVar1) {
    local_88 = lVar3;
  }
  rhs = (parameters->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_80 = piVar4;
  bVar1 = cmHasLiteralPrefix<char_const*,3ul>(&rhs,(char (*) [3])0x52e465);
  if (bVar1) {
LAB_00415c10:
    rhs = rhs + 2;
    iVar6 = 2;
  }
  else {
    bVar1 = cmHasLiteralPrefix<char_const*,3ul>(&rhs,(char (*) [3])0x52e469);
    iVar6 = 0;
    if (bVar1) goto LAB_00415c10;
  }
  bVar1 = cmHasLiteralPrefix<char_const*,4ul>(&rhs,(char (*) [4])"-0b");
  if ((bVar1) || (bVar1 = cmHasLiteralPrefix<char_const*,4ul>(&rhs,(char (*) [4])"-0B"), bVar1)) {
    rhs = rhs + 3;
    bVar1 = true;
    iVar6 = 2;
  }
  else {
    bVar1 = false;
  }
  bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&rhs,(char (*) [4])"+0b");
  if ((bVar2) || (bVar2 = cmHasLiteralPrefix<char_const*,4ul>(&rhs,(char (*) [4])"+0B"), bVar2)) {
    iVar6 = 2;
    rhs = rhs + 3;
  }
  lVar3 = strtol(rhs,&pEnd,iVar6);
  if (((pEnd != rhs) && (*pEnd == '\0')) && (*local_80 != 0x22)) {
    lVar5 = -lVar3;
    if (!bVar1) {
      lVar5 = lVar3;
    }
    pcVar7 = "0";
    if (local_88 == lVar5) {
      pcVar7 = "1";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar7,(allocator *)&local_a8);
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_a8,content);
  std::operator+(&local_78,"$<EQUAL> parameter ",
                 (parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  std::operator+(&local_58,&local_78," is not a valid integer.");
  reportError(local_b0,&local_a8,&local_58);
LAB_00415b80:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    char* pEnd;

    int base = 0;
    bool flipSign = false;

    const char* lhs = parameters[0].c_str();
    if (cmHasLiteralPrefix(lhs, "0b") || cmHasLiteralPrefix(lhs, "0B")) {
      base = 2;
      lhs += 2;
    }
    if (cmHasLiteralPrefix(lhs, "-0b") || cmHasLiteralPrefix(lhs, "-0B")) {
      base = 2;
      lhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(lhs, "+0b") || cmHasLiteralPrefix(lhs, "+0B")) {
      base = 2;
      lhs += 3;
    }

    long lnum = strtol(lhs, &pEnd, base);
    if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[0] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      lnum = -lnum;
    }

    base = 0;
    flipSign = false;

    const char* rhs = parameters[1].c_str();
    if (cmHasLiteralPrefix(rhs, "0b") || cmHasLiteralPrefix(rhs, "0B")) {
      base = 2;
      rhs += 2;
    }
    if (cmHasLiteralPrefix(rhs, "-0b") || cmHasLiteralPrefix(rhs, "-0B")) {
      base = 2;
      rhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(rhs, "+0b") || cmHasLiteralPrefix(rhs, "+0B")) {
      base = 2;
      rhs += 3;
    }

    long rnum = strtol(rhs, &pEnd, base);
    if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[1] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      rnum = -rnum;
    }

    return lnum == rnum ? "1" : "0";
  }